

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O3

void start_pass(j_decompress_ptr cinfo)

{
  undefined4 *puVar1;
  double dVar2;
  jpeg_inverse_dct *pjVar3;
  JQUANT_TBL *pJVar4;
  void *pvVar5;
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  uint6 uVar10;
  uint uVar11;
  undefined1 auVar12 [14];
  undefined1 auVar13 [14];
  unkbyte10 Var14;
  undefined1 auVar15 [12];
  undefined1 auVar16 [14];
  inverse_DCT_method_ptr p_Var17;
  code *pcVar18;
  jpeg_error_mgr *pjVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  double *pdVar28;
  long lVar29;
  jpeg_component_info *pjVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  ulong uVar33;
  uint uVar39;
  undefined1 auVar34 [16];
  undefined1 auVar37 [16];
  uint uVar40;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined2 uVar38;
  
  if (0 < cinfo->num_components) {
    pjVar30 = cinfo->comp_info;
    pjVar3 = cinfo->idct;
    lVar29 = 0;
    p_Var17 = (inverse_DCT_method_ptr)0x0;
    uVar21 = 0;
    do {
      iVar20 = pjVar30->DCT_h_scaled_size;
      iVar24 = iVar20 * 0x100 + pjVar30->DCT_v_scaled_size;
      if (iVar24 < 0x70e) {
        if (0x403 < iVar24) {
          if (iVar24 < 0x603) {
            if (iVar24 < 0x505) {
              if (iVar24 == 0x404) {
                pcVar18 = jpeg_idct_4x4;
              }
              else {
                if (iVar24 != 0x408) goto LAB_0027f17d;
                pcVar18 = jpeg_idct_4x8;
              }
            }
            else if (iVar24 == 0x505) {
              pcVar18 = jpeg_idct_5x5;
            }
            else {
              if (iVar24 != 0x50a) goto LAB_0027f17d;
              pcVar18 = jpeg_idct_5x10;
            }
          }
          else if (iVar24 < 0x60c) {
            if (iVar24 == 0x603) {
              pcVar18 = jpeg_idct_6x3;
            }
            else {
              if (iVar24 != 0x606) goto LAB_0027f17d;
              pcVar18 = jpeg_idct_6x6;
            }
          }
          else if (iVar24 == 0x60c) {
            pcVar18 = jpeg_idct_6x12;
          }
          else {
            if (iVar24 != 0x707) goto LAB_0027f17d;
            pcVar18 = jpeg_idct_7x7;
          }
          goto LAB_0027f005;
        }
        if (0x203 < iVar24) {
          if (iVar24 < 0x306) {
            if (iVar24 == 0x204) {
              pcVar18 = jpeg_idct_2x4;
            }
            else {
              if (iVar24 != 0x303) goto LAB_0027f17d;
              pcVar18 = jpeg_idct_3x3;
            }
          }
          else if (iVar24 == 0x306) {
            pcVar18 = jpeg_idct_3x6;
          }
          else {
            if (iVar24 != 0x402) goto LAB_0027f17d;
            pcVar18 = jpeg_idct_4x2;
          }
          goto LAB_0027f005;
        }
        if (0x200 < iVar24) {
          if (iVar24 == 0x201) {
            pcVar18 = jpeg_idct_2x1;
          }
          else {
            if (iVar24 != 0x202) goto LAB_0027f17d;
            pcVar18 = jpeg_idct_2x2;
          }
          goto LAB_0027f005;
        }
        pcVar18 = jpeg_idct_1x1;
        uVar22 = 0;
        if (iVar24 != 0x101) {
          if (iVar24 != 0x102) {
LAB_0027f17d:
            pjVar19 = cinfo->err;
            pjVar19->msg_code = 7;
            (pjVar19->msg_parm).i[0] = iVar20;
            (cinfo->err->msg_parm).i[1] = pjVar30->DCT_v_scaled_size;
            pjVar19 = cinfo->err;
            goto LAB_0027f1a8;
          }
          pcVar18 = jpeg_idct_1x2;
          goto LAB_0027f005;
        }
      }
      else {
        if (iVar24 < 0xc06) {
          if (iVar24 < 0x909) {
            if (iVar24 < 0x808) {
              if (iVar24 == 0x70e) {
                pcVar18 = jpeg_idct_7x14;
              }
              else {
                if (iVar24 != 0x804) goto LAB_0027f17d;
                pcVar18 = jpeg_idct_8x4;
              }
            }
            else {
              if (iVar24 == 0x808) {
                uVar22 = (ulong)cinfo->dct_method;
                if (uVar22 < 3) {
                  pcVar18 = (code *)(&PTR_jpeg_idct_islow_003b04e0)[uVar22];
                  goto LAB_0027f007;
                }
                pjVar19 = cinfo->err;
                pjVar19->msg_code = 0x31;
LAB_0027f1a8:
                (*pjVar19->error_exit)((j_common_ptr)cinfo);
                pcVar18 = p_Var17;
                uVar22 = uVar21;
                goto LAB_0027f007;
              }
              if (iVar24 != 0x810) goto LAB_0027f17d;
              pcVar18 = jpeg_idct_8x16;
            }
          }
          else if (iVar24 < 0xa0a) {
            if (iVar24 == 0x909) {
              pcVar18 = jpeg_idct_9x9;
            }
            else {
              if (iVar24 != 0xa05) goto LAB_0027f17d;
              pcVar18 = jpeg_idct_10x5;
            }
          }
          else if (iVar24 == 0xa0a) {
            pcVar18 = jpeg_idct_10x10;
          }
          else {
            if (iVar24 != 0xb0b) goto LAB_0027f17d;
            pcVar18 = jpeg_idct_11x11;
          }
        }
        else if (iVar24 < 0xe0e) {
          if (iVar24 < 0xd0d) {
            if (iVar24 == 0xc06) {
              pcVar18 = jpeg_idct_12x6;
            }
            else {
              if (iVar24 != 0xc0c) goto LAB_0027f17d;
              pcVar18 = jpeg_idct_12x12;
            }
          }
          else if (iVar24 == 0xd0d) {
            pcVar18 = jpeg_idct_13x13;
          }
          else {
            if (iVar24 != 0xe07) goto LAB_0027f17d;
            pcVar18 = jpeg_idct_14x7;
          }
        }
        else if (iVar24 < 0x1008) {
          if (iVar24 == 0xe0e) {
            pcVar18 = jpeg_idct_14x14;
          }
          else {
            if (iVar24 != 0xf0f) goto LAB_0027f17d;
            pcVar18 = jpeg_idct_15x15;
          }
        }
        else if (iVar24 == 0x1008) {
          pcVar18 = jpeg_idct_16x8;
        }
        else {
          if (iVar24 != 0x1010) goto LAB_0027f17d;
          pcVar18 = jpeg_idct_16x16;
        }
LAB_0027f005:
        uVar22 = 0;
      }
LAB_0027f007:
      pjVar3->inverse_DCT[lVar29] = pcVar18;
      if (((pjVar30->component_needed != 0) &&
          (iVar20 = (int)uVar22, *(int *)((long)pjVar3[1].inverse_DCT + lVar29 * 4 + -8) != iVar20))
         && (pJVar4 = pjVar30->quant_table, pJVar4 != (JQUANT_TBL *)0x0)) {
        *(int *)((long)pjVar3[1].inverse_DCT + lVar29 * 4 + -8) = iVar20;
        pvVar5 = pjVar30->dct_table;
        lVar25 = 0;
        if (iVar20 == 0) {
          do {
            uVar21 = *(ulong *)(pJVar4->quantval + lVar25);
            auVar7._8_4_ = 0;
            auVar7._0_8_ = uVar21;
            auVar7._12_2_ = (short)(uVar21 >> 0x30);
            auVar9._8_2_ = (short)(uVar21 >> 0x20);
            auVar9._0_8_ = uVar21;
            auVar9._10_4_ = auVar7._10_4_;
            auVar16._6_8_ = 0;
            auVar16._0_6_ = auVar9._8_6_;
            auVar32._6_8_ = SUB148(auVar16 << 0x40,6);
            auVar32._4_2_ = (short)(uVar21 >> 0x10);
            auVar32._0_2_ = (ushort)uVar21;
            auVar32._2_2_ = 0;
            auVar32._14_2_ = 0;
            *(undefined1 (*) [16])((long)pvVar5 + lVar25 * 4) = auVar32;
            lVar25 = lVar25 + 4;
          } while (lVar25 != 0x40);
        }
        else if (iVar20 == 1) {
          do {
            uVar21 = *(ulong *)((long)pJVar4->quantval + lVar25);
            auVar6._8_4_ = 0;
            auVar6._0_8_ = uVar21;
            auVar6._12_2_ = (short)(uVar21 >> 0x30);
            auVar8._8_2_ = (short)(uVar21 >> 0x20);
            auVar8._0_8_ = uVar21;
            auVar8._10_4_ = auVar6._10_4_;
            uVar10 = auVar8._8_6_;
            auVar13._6_8_ = 0;
            auVar13._0_6_ = uVar10;
            Var14 = CONCAT82(SUB148(auVar13 << 0x40,6),(short)(uVar21 >> 0x10));
            auVar12._2_2_ = 0;
            auVar12._0_2_ = (ushort)uVar21;
            auVar12._4_10_ = Var14;
            uVar33 = (ulong)(uint)Var14;
            uVar11 = auVar6._10_4_ >> 0x10;
            uVar21 = *(ulong *)((long)start_pass::aanscales + lVar25);
            uVar38 = (undefined2)(uVar21 >> 0x30);
            auVar36._8_4_ = 0;
            auVar36._0_8_ = uVar21;
            auVar36._12_2_ = uVar38;
            auVar36._14_2_ = uVar38;
            uVar38 = (undefined2)(uVar21 >> 0x20);
            auVar35._12_4_ = auVar36._12_4_;
            auVar35._8_2_ = 0;
            auVar35._0_8_ = uVar21;
            auVar35._10_2_ = uVar38;
            auVar34._10_6_ = auVar35._10_6_;
            auVar34._8_2_ = uVar38;
            auVar34._0_8_ = uVar21;
            uVar38 = (undefined2)(uVar21 >> 0x10);
            auVar15._4_8_ = auVar34._8_8_;
            auVar15._2_2_ = uVar38;
            auVar15._0_2_ = uVar38;
            auVar37._4_4_ = auVar15._0_4_ >> 0x10;
            uVar39 = auVar34._8_4_ >> 0x10;
            auVar37._12_4_ = auVar35._12_4_ >> 0x10;
            uVar40 = -(uint)((short)uVar21 < 0);
            auVar37._0_4_ = uVar39;
            auVar37._8_4_ = auVar37._12_4_;
            auVar31._4_4_ = -(uint)((int)auVar37._4_4_ < 0);
            auVar31._0_4_ = uVar40;
            auVar31._8_4_ = -(uint)((int)auVar37._4_4_ < 0);
            auVar31._12_4_ = -(uint)(auVar37._12_4_ < 0);
            puVar1 = (undefined4 *)((long)pvVar5 + lVar25 * 2);
            *puVar1 = (int)((ulong)(uint)(int)(short)uVar21 * (auVar12._0_8_ & 0xffffffff) + 0x800 +
                            ((ulong)uVar40 * (auVar12._0_8_ & 0xffffffff) << 0x20) >> 0xc);
            puVar1[1] = (int)(auVar37._4_4_ * uVar33 + 0x800 +
                              ((auVar31._8_8_ & 0xffffffff) * uVar33 << 0x20) >> 0xc);
            puVar1[2] = (int)((ulong)uVar39 * ((ulong)uVar10 & 0xffffffff) + 0x800 +
                              ((ulong)-(uint)((int)uVar39 < 0) * ((ulong)uVar10 & 0xffffffff) <<
                              0x20) >> 0xc);
            puVar1[3] = (int)((auVar37._8_8_ & 0xffffffff) * (ulong)uVar11 + 0x800 +
                              ((ulong)-(uint)(auVar37._12_4_ < 0) * (ulong)uVar11 << 0x20) >> 0xc);
            lVar25 = lVar25 + 8;
          } while (lVar25 != 0x80);
        }
        else {
          lVar26 = 0;
          do {
            lVar27 = (long)(int)lVar26;
            lVar26 = lVar27 + 8;
            dVar2 = start_pass::aanscalefactor[lVar25];
            pdVar28 = start_pass::aanscalefactor;
            lVar23 = 0;
            do {
              *(ulong *)((long)pvVar5 + lVar23 * 4 + lVar27 * 4) =
                   CONCAT44((float)((double)(*(uint *)(pJVar4->quantval + lVar27 + lVar23) >> 0x10)
                                    * dVar2 * pdVar28[1] * 0.125),
                            (float)((double)(*(uint *)(pJVar4->quantval + lVar27 + lVar23) & 0xffff)
                                    * dVar2 * *pdVar28 * 0.125));
              lVar23 = lVar23 + 2;
              pdVar28 = pdVar28 + 2;
            } while (lVar23 != 8);
            lVar25 = lVar25 + 1;
          } while (lVar25 != 8);
        }
      }
      lVar29 = lVar29 + 1;
      pjVar30 = pjVar30 + 1;
      p_Var17 = pcVar18;
      uVar21 = uVar22;
    } while (lVar29 < cinfo->num_components);
  }
  return;
}

Assistant:

METHODDEF(void)
start_pass (j_decompress_ptr cinfo)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  int ci, tbl;
  jpeg_component_info * compptr;

  if (cinfo->progressive_mode) {
    /* Validate progressive scan parameters */
    if (cinfo->Ss == 0) {
      if (cinfo->Se != 0)
	goto bad;
    } else {
      /* need not check Ss/Se < 0 since they came from unsigned bytes */
      if (cinfo->Se < cinfo->Ss || cinfo->Se > cinfo->lim_Se)
	goto bad;
      /* AC scans may have only one component */
      if (cinfo->comps_in_scan != 1)
	goto bad;
    }
    if (cinfo->Ah != 0) {
      /* Successive approximation refinement scan: must have Al = Ah-1. */
      if (cinfo->Ah-1 != cinfo->Al)
	goto bad;
    }
    if (cinfo->Al > 13) {	/* need not check for < 0 */
      bad:
      ERREXIT4(cinfo, JERR_BAD_PROGRESSION,
	       cinfo->Ss, cinfo->Se, cinfo->Ah, cinfo->Al);
    }
    /* Update progression status, and verify that scan order is legal.
     * Note that inter-scan inconsistencies are treated as warnings
     * not fatal errors ... not clear if this is right way to behave.
     */
    for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
      int coefi, cindex = cinfo->cur_comp_info[ci]->component_index;
      int *coef_bit_ptr = & cinfo->coef_bits[cindex][0];
      if (cinfo->Ss && coef_bit_ptr[0] < 0) /* AC without prior DC scan */
	WARNMS2(cinfo, JWRN_BOGUS_PROGRESSION, cindex, 0);
      for (coefi = cinfo->Ss; coefi <= cinfo->Se; coefi++) {
	int expected = (coef_bit_ptr[coefi] < 0) ? 0 : coef_bit_ptr[coefi];
	if (cinfo->Ah != expected)
	  WARNMS2(cinfo, JWRN_BOGUS_PROGRESSION, cindex, coefi);
	coef_bit_ptr[coefi] = cinfo->Al;
      }
    }
    /* Select MCU decoding routine */
    if (cinfo->Ah == 0) {
      if (cinfo->Ss == 0)
	entropy->pub.decode_mcu = decode_mcu_DC_first;
      else
	entropy->pub.decode_mcu = decode_mcu_AC_first;
    } else {
      if (cinfo->Ss == 0)
	entropy->pub.decode_mcu = decode_mcu_DC_refine;
      else
	entropy->pub.decode_mcu = decode_mcu_AC_refine;
    }
  } else {
    /* Check that the scan parameters Ss, Se, Ah/Al are OK for sequential JPEG.
     * This ought to be an error condition, but we make it a warning.
     */
    if (cinfo->Ss != 0 || cinfo->Ah != 0 || cinfo->Al != 0 ||
	(cinfo->Se < DCTSIZE2 && cinfo->Se != cinfo->lim_Se))
      WARNMS(cinfo, JWRN_NOT_SEQUENTIAL);
    /* Select MCU decoding routine */
    entropy->pub.decode_mcu = decode_mcu;
  }

  /* Allocate & initialize requested statistics areas */
  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    if (! cinfo->progressive_mode || (cinfo->Ss == 0 && cinfo->Ah == 0)) {
      tbl = compptr->dc_tbl_no;
      if (tbl < 0 || tbl >= NUM_ARITH_TBLS)
	ERREXIT1(cinfo, JERR_NO_ARITH_TABLE, tbl);
      if (entropy->dc_stats[tbl] == NULL)
	entropy->dc_stats[tbl] = (unsigned char *) (*cinfo->mem->alloc_small)
	  ((j_common_ptr) cinfo, JPOOL_IMAGE, DC_STAT_BINS);
      MEMZERO(entropy->dc_stats[tbl], DC_STAT_BINS);
      /* Initialize DC predictions to 0 */
      entropy->last_dc_val[ci] = 0;
      entropy->dc_context[ci] = 0;
    }
    if ((! cinfo->progressive_mode && cinfo->lim_Se) ||
	(cinfo->progressive_mode && cinfo->Ss)) {
      tbl = compptr->ac_tbl_no;
      if (tbl < 0 || tbl >= NUM_ARITH_TBLS)
	ERREXIT1(cinfo, JERR_NO_ARITH_TABLE, tbl);
      if (entropy->ac_stats[tbl] == NULL)
	entropy->ac_stats[tbl] = (unsigned char *) (*cinfo->mem->alloc_small)
	  ((j_common_ptr) cinfo, JPOOL_IMAGE, AC_STAT_BINS);
      MEMZERO(entropy->ac_stats[tbl], AC_STAT_BINS);
    }
  }

  /* Initialize arithmetic decoding variables */
  entropy->c = 0;
  entropy->a = 0;
  entropy->ct = -16;	/* force reading 2 initial bytes to fill C */

  /* Initialize restart counter */
  entropy->restarts_to_go = cinfo->restart_interval;
}